

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_checkCParams(ZSTD_compressionParameters cParams)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_windowLog,cParams.windowLog);
  sVar2 = 0xffffffffffffffd6;
  if (iVar1 != 0) {
    iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_chainLog,cParams.chainLog);
    if (iVar1 != 0) {
      iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_hashLog,cParams.hashLog);
      if (iVar1 != 0) {
        iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_searchLog,cParams.searchLog);
        if (iVar1 != 0) {
          iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_minMatch,cParams.minMatch);
          if (iVar1 != 0) {
            iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_targetLength,cParams.targetLength);
            if (iVar1 != 0) {
              iVar1 = ZSTD_cParam_withinBounds(ZSTD_c_strategy,cParams.strategy);
              sVar2 = 0xffffffffffffffd6;
              if (iVar1 != 0) {
                sVar2 = 0;
              }
            }
          }
        }
      }
    }
  }
  return sVar2;
}

Assistant:

size_t ZSTD_checkCParams(ZSTD_compressionParameters cParams)
{
    BOUNDCHECK(ZSTD_c_windowLog, (int)cParams.windowLog);
    BOUNDCHECK(ZSTD_c_chainLog,  (int)cParams.chainLog);
    BOUNDCHECK(ZSTD_c_hashLog,   (int)cParams.hashLog);
    BOUNDCHECK(ZSTD_c_searchLog, (int)cParams.searchLog);
    BOUNDCHECK(ZSTD_c_minMatch,  (int)cParams.minMatch);
    BOUNDCHECK(ZSTD_c_targetLength,(int)cParams.targetLength);
    BOUNDCHECK(ZSTD_c_strategy,  cParams.strategy);
    return 0;
}